

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unixRead(unqlite_file *id,void *pBuf,unqlite_int64 amt,unqlite_int64 offset)

{
  __off_t _Var1;
  ssize_t sVar2;
  int *piVar3;
  uint uVar4;
  undefined1 *puVar5;
  int iVar6;
  uint uVar7;
  undefined1 *puVar8;
  
  iVar6 = 0;
  _Var1 = lseek(*(int *)&id[2].pMethods,offset,0);
  if (_Var1 == offset) {
    sVar2 = read(*(int *)&id[2].pMethods,pBuf,(long)(int)amt);
    uVar7 = (uint)sVar2;
    uVar4 = uVar7;
    if (-1 < (int)uVar7) goto LAB_0010f984;
LAB_0010f979:
    uVar7 = uVar4;
    piVar3 = __errno_location();
    iVar6 = *piVar3;
  }
  else {
    uVar7 = 0xffffffff;
    uVar4 = 0xffffffff;
    if (_Var1 == -1) goto LAB_0010f979;
  }
  *(int *)((long)&id[3].pMethods + 4) = iVar6;
LAB_0010f984:
  iVar6 = 0;
  uVar4 = (int)amt - uVar7;
  if ((uVar4 != 0) && (iVar6 = -2, -1 < (int)uVar7)) {
    *(undefined4 *)((long)&id[3].pMethods + 4) = 0;
    puVar8 = (undefined1 *)((long)pBuf + (ulong)uVar7);
    puVar5 = puVar8 + uVar4;
    do {
      *puVar8 = 0;
      if (puVar5 <= puVar8 + 1) {
        return -2;
      }
      puVar8[1] = 0;
      if (puVar5 <= puVar8 + 2) {
        return -2;
      }
      puVar8[2] = 0;
      if (puVar5 <= puVar8 + 3) {
        return -2;
      }
      puVar8[3] = 0;
      puVar8 = puVar8 + 4;
    } while (puVar8 < puVar5);
  }
  return iVar6;
}

Assistant:

static int unixRead(
  unqlite_file *id, 
  void *pBuf, 
  unqlite_int64 amt,
  unqlite_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  
  got = seekAndRead(pFile, offset, pBuf, (int)amt);
  if( got==(int)amt ){
    return UNQLITE_OK;
  }else if( got<0 ){
    /* lastErrno set by seekAndRead */
    return UNQLITE_IOERR;
  }else{
    pFile->lastErrno = 0; /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    SyZero(&((char*)pBuf)[got],(sxu32)amt-got);
    return UNQLITE_IOERR;
  }
}